

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O3

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::apps::Clone::getMessage(Clone *this,int index)

{
  long lVar1;
  Message *pMVar2;
  Message *this_00;
  uint in_EDX;
  undefined4 in_register_00000034;
  
  if (((int)in_EDX < 0) ||
     (lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 0x140),
     (int)((ulong)(*(long *)(CONCAT44(in_register_00000034,index) + 0x148) - lVar1) >> 3) <=
     (int)in_EDX)) {
    this_00 = (Message *)0x0;
  }
  else {
    pMVar2 = *(Message **)(lVar1 + (ulong)in_EDX * 8);
    this_00 = (Message *)operator_new(0x100);
    Message::Message(this_00,pMVar2);
  }
  (this->super_App)._vptr_App = (_func_int **)this_00;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> Clone::getMessage(int index) const
{
    if (isValidIndex(index, messages)) {
        return std::make_unique<Message>(*messages[index]);
    }
    return nullptr;
}